

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::SubsurfModifierData>
          (Structure *this,SubsurfModifierData *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  SubsurfModifierData *dest_local;
  Structure *this_local;
  
  ReadField<2,Assimp::Blender::ModifierData>(this,&dest->modifier,"modifier",db);
  ReadField<1,short>(this,&dest->subdivType,"subdivType",db);
  ReadField<2,short>(this,&dest->levels,"levels",db);
  ReadField<1,short>(this,&dest->renderLevels,"renderLevels",db);
  ReadField<1,short>(this,&dest->flags,"flags",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<SubsurfModifierData> (
    SubsurfModifierData& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.modifier,"modifier",db);
    ReadField<ErrorPolicy_Warn>(dest.subdivType,"subdivType",db);
    ReadField<ErrorPolicy_Fail>(dest.levels,"levels",db);
    ReadField<ErrorPolicy_Igno>(dest.renderLevels,"renderLevels",db);
    ReadField<ErrorPolicy_Igno>(dest.flags,"flags",db);

    db.reader->IncPtr(size);
}